

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O1

int WebRtcIsac_DecHistOneStepMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *init_index,int N)

{
  uint8_t *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  bool bVar15;
  
  uVar14 = streamdata->W_upper;
  if (uVar14 == 0) {
    return -2;
  }
  puVar5 = streamdata->stream + streamdata->stream_index;
  if (streamdata->stream_index == 0) {
    uVar11 = *(uint *)puVar5;
    puVar5 = puVar5 + 3;
    uVar9 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  }
  else {
    uVar9 = streamdata->streamval;
  }
  if (0 < N) {
    do {
      uVar8 = uVar14 & 0xffff;
      uVar10 = uVar14 >> 0x10;
      puVar3 = *cdf;
      uVar11 = (puVar3[*init_index] * uVar8 >> 0x10) + uVar10 * puVar3[*init_index];
      uVar7 = (ulong)((uint)*init_index * 2);
      if (uVar11 < uVar9) {
        do {
          uVar13 = uVar11;
          if (*(short *)((long)puVar3 + uVar7) == -1) {
            return -3;
          }
          uVar11 = (uint)*(ushort *)((long)puVar3 + uVar7 + 2);
          uVar12 = (uVar11 * uVar8 >> 0x10) + uVar10 * uVar11;
          uVar7 = uVar7 + 2;
          uVar11 = uVar12;
        } while (uVar12 < uVar9);
        iVar6 = (int)((long)uVar7 >> 1) + -1;
      }
      else {
        do {
          uVar12 = uVar11;
          puVar2 = (ushort *)((long)puVar3 + (uVar7 - 2));
          if (puVar2 < puVar3) {
            return -3;
          }
          uVar11 = (uint)*puVar2;
          uVar13 = (uVar11 * uVar8 >> 0x10) + uVar10 * uVar11;
          uVar7 = uVar7 - 2;
          uVar11 = uVar13;
        } while (uVar9 <= uVar13);
        iVar6 = (int)(uVar7 >> 1);
      }
      *data = iVar6;
      uVar14 = uVar12 - (uVar13 + 1);
      uVar9 = uVar9 - (uVar13 + 1);
      uVar11 = uVar14;
      if (uVar14 < 0x1000000) {
        do {
          puVar1 = puVar5 + 1;
          puVar5 = puVar5 + 1;
          uVar9 = uVar9 << 8 | (uint)*puVar1;
          uVar14 = uVar11 << 8;
          bVar15 = uVar11 < 0x10000;
          uVar11 = uVar14;
        } while (bVar15);
      }
      init_index = init_index + 1;
      data = data + 1;
      cdf = cdf + 1;
      bVar15 = 1 < N;
      N = N + -1;
    } while (bVar15);
  }
  uVar4 = (int)puVar5 - (int)streamdata;
  streamdata->stream_index = uVar4;
  streamdata->W_upper = uVar14;
  streamdata->streamval = uVar9;
  if (uVar14 < 0x2000000) {
    iVar6 = uVar4 - 1;
  }
  else {
    iVar6 = uVar4 - 2;
  }
  return iVar6;
}

Assistant:

int WebRtcIsac_DecHistOneStepMulti(int *data,        /* output: data vector */
                                   Bitstr *streamdata,      /* in-/output struct containing bitstream */
                                   const uint16_t **cdf,   /* input: array of cdf arrays */
                                   const uint16_t *init_index, /* input: vector of initial cdf table search entries */
                                   const int N)     /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     k;


  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }


  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start at the specified table entry */
    cdf_ptr = *cdf + (*init_index++);
    W_tmp = W_upper_MSB * *cdf_ptr;
    W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
    if (streamval > W_tmp)
    {
      for ( ;; )
      {
        W_lower = W_tmp;
        if (cdf_ptr[0]==65535)
          /* range check */
          return -3;
        W_tmp = W_upper_MSB * *++cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval <= W_tmp) break;
      }
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    } else {
      for ( ;; )
      {
        W_upper = W_tmp;
        --cdf_ptr;
        if (cdf_ptr<*cdf) {
          /* range check */
          return -3;
        }
        W_tmp = W_upper_MSB * *cdf_ptr;
        W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
        if (streamval > W_tmp) break;
      }
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;
    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }
  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}